

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.cpp
# Opt level: O3

bool __thiscall Xml::Private::parseElement(Private *this,Element *element)

{
  String *other;
  usize *puVar1;
  usize uVar2;
  Type TVar3;
  int iVar4;
  Data *pDVar5;
  String *other_00;
  bool bVar6;
  bool bVar7;
  Iterator this_00;
  Element *element_00;
  List<Xml::Variant> *this_01;
  String attributeName;
  Position pos;
  String local_c0;
  String local_98;
  String *local_70;
  Position *local_68;
  String *local_60;
  String local_58;
  
  element->line = (this->token).pos.line;
  element->column = (*(int *)&(this->token).pos.pos - *(int *)&(this->token).pos.lineStart) + 1;
  bVar6 = readToken(this);
  if (bVar6) {
    if ((this->token).type == nameType) {
      other = &(this->token).value;
      String::operator=(&element->type,other);
      bVar6 = readToken(this);
      if (bVar6) {
        local_70 = &this->errorString;
        local_60 = &element->type;
        do {
          TVar3 = (this->token).type;
          if (TVar3 == nameType) {
            String::String(&local_c0,other);
            bVar7 = readToken(this);
            bVar6 = true;
            if (bVar7) {
              if ((this->token).type == equalsSignType) {
                bVar7 = readToken(this);
                if (bVar7) {
                  if ((this->token).type != stringType) {
                    local_98.data = &local_98._data;
                    local_98._data.ref = 0;
                    local_98._data.str = "Expected string";
                    local_98._data.len = 0xf;
                    iVar4 = *(int *)&(this->token).pos.pos;
                    this->errorLine = (this->token).pos.line;
                    this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
                    String::operator=(local_70,&local_98);
                    goto LAB_0010844f;
                  }
                  HashMap<String,_String>::insert
                            (&element->attributes,&(element->attributes)._end,&local_c0,other);
                  bVar6 = false;
                }
              }
              else {
                local_98.data = &local_98._data;
                local_98._data.ref = 0;
                local_98._data.str = "Expected \'=\'";
                local_98._data.len = 0xc;
                iVar4 = *(int *)&(this->token).pos.pos;
                this->errorLine = (this->token).pos.line;
                this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
                String::operator=(local_70,&local_98);
LAB_0010844f:
                if ((local_98.data)->ref != 0) {
                  LOCK();
                  puVar1 = &(local_98.data)->ref;
                  *puVar1 = *puVar1 - 1;
                  UNLOCK();
                  if ((*puVar1 == 0) && (local_98.data != (Data *)0x0)) {
                    operator_delete__(local_98.data);
                  }
                }
              }
            }
            if ((local_c0.data)->ref != 0) {
              LOCK();
              puVar1 = &(local_c0.data)->ref;
              *puVar1 = *puVar1 - 1;
              UNLOCK();
              if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
                operator_delete__(local_c0.data);
              }
            }
            if (bVar6) {
              return false;
            }
          }
          else {
            if (TVar3 == tagEndType) {
              local_68 = &this->pos;
              this_01 = &element->content;
              goto LAB_0010858e;
            }
            if (TVar3 == emptyTagEndType) {
              return true;
            }
          }
          bVar6 = readToken(this);
        } while (bVar6);
      }
    }
    else {
      local_c0.data = &local_c0._data;
      local_c0._data.ref = 0;
      local_c0._data.str = "Expected tag name";
      local_c0._data.len = 0x11;
      iVar4 = *(int *)&(this->token).pos.pos;
      this->errorLine = (this->token).pos.line;
      this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
      String::operator=(&this->errorString,&local_c0);
LAB_00108543:
      if ((local_c0.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_c0.data)->ref;
        *puVar1 = *puVar1 - 1;
        uVar2 = *puVar1;
        UNLOCK();
        pDVar5 = local_c0.data;
joined_r0x001087bf:
        if ((uVar2 == 0) && (pDVar5 != (Data *)0x0)) {
          operator_delete__(pDVar5);
        }
      }
    }
  }
  return false;
LAB_0010858e:
  local_98._data.len = (usize)local_68->lineStart;
  local_98.data = *(Data **)local_68;
  local_98._data.str = local_68->pos;
  bVar6 = readToken(this);
  if (bVar6) {
    TVar3 = (this->token).type;
    if (TVar3 != startTagBeginType) {
      if (TVar3 != endTagBeginType) {
        local_68->lineStart = (char *)local_98._data.len;
        *(Data **)local_68 = local_98.data;
        local_68->pos = local_98._data.str;
        goto LAB_001085d9;
      }
      bVar6 = readToken(this);
      other_00 = local_60;
      if (!bVar6) {
        return false;
      }
      if ((this->token).type != nameType) {
        local_c0.data = &local_c0._data;
        local_c0._data.ref = 0;
        local_c0._data.str = "Expected tag name";
        local_c0._data.len = 0x11;
        iVar4 = *(int *)&(this->token).pos.pos;
        this->errorLine = (this->token).pos.line;
        this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
        String::operator=(local_70,&local_c0);
        goto LAB_00108543;
      }
      bVar6 = String::operator!=(other,local_60);
      if (!bVar6) {
        bVar6 = readToken(this);
        if (!bVar6) {
          return false;
        }
        if ((this->token).type == tagEndType) {
          return true;
        }
        local_c0.data = &local_c0._data;
        local_c0._data.ref = 0;
        local_c0._data.str = "Expected \'>\'";
        local_c0._data.len = 0xc;
        iVar4 = *(int *)&(this->token).pos.pos;
        this->errorLine = (this->token).pos.line;
        this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
        String::operator=(local_70,&local_c0);
        goto LAB_00108543;
      }
      local_58.data = &local_58._data;
      local_58._data.ref = 0;
      local_58._data.str = "Expected end tag of \'";
      local_58._data.len = 0x15;
      String::operator+(&local_98,&local_58,other_00);
      String::operator+(&local_c0,&local_98,(char (*) [2])0x10d89a);
      iVar4 = *(int *)&(this->token).pos.pos;
      this->errorLine = (this->token).pos.line;
      this->errorColumn = (iVar4 - *(int *)&(this->token).pos.lineStart) + 1;
      String::operator=(local_70,&local_c0);
      if ((local_c0.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_c0.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
          operator_delete__(local_c0.data);
        }
      }
      if ((local_98.data)->ref != 0) {
        LOCK();
        puVar1 = &(local_98.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (local_98.data != (Data *)0x0)) {
          operator_delete__(local_98.data);
        }
      }
      if ((local_58.data)->ref == 0) {
        return false;
      }
      LOCK();
      puVar1 = &(local_58.data)->ref;
      *puVar1 = *puVar1 - 1;
      uVar2 = *puVar1;
      UNLOCK();
      pDVar5 = local_58.data;
      goto joined_r0x001087bf;
    }
    local_c0.data = (Data *)&Variant::nullData;
    this_00 = List<Xml::Variant>::insert(this_01,&this_01->_end,(Variant *)&local_c0);
    Variant::clear((Variant *)&local_c0);
    element_00 = Variant::toElement(&(this_00.item)->value);
    bVar6 = parseElement(this,element_00);
  }
  else {
LAB_001085d9:
    local_c0.data = &String::emptyData.super_Data;
    bVar6 = parseText(this,&local_c0);
    if (bVar6) {
      local_58.data = (Data *)operator_new__(0x38);
      String::String((String *)&(local_58.data)->capacity,&local_c0);
      *(undefined4 *)&(local_58.data)->str = 2;
      (local_58.data)->len = 1;
      List<Xml::Variant>::insert(this_01,&this_01->_end,(Variant *)&local_58);
      Variant::clear((Variant *)&local_58);
    }
    if ((local_c0.data)->ref != 0) {
      LOCK();
      puVar1 = &(local_c0.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (local_c0.data != (Data *)0x0)) {
        operator_delete__(local_c0.data);
      }
    }
  }
  if (!bVar6) {
    return false;
  }
  goto LAB_0010858e;
}

Assistant:

bool Xml::Private::parseElement(Element& element)
{
  element.line = token.pos.line;
  element.column = (int)(token.pos.pos - token.pos.lineStart) + 1;
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  element.type = token.value;
  for(;;)
  {
    if(!readToken())
      return false;
    if(token.type == Token::emptyTagEndType)
      return true;
    if(token.type == Token::tagEndType)
      break;
    if(token.type == Token::nameType)
    {
      String attributeName = token.value;
      if(!readToken())
        return false;
      if(token.type != Token::equalsSignType)
        return syntaxError(token.pos, "Expected '='"), false;
      if(!readToken())
        return false;
      if(token.type != Token::stringType)
        return syntaxError(token.pos, "Expected string"), false;
      element.attributes.append(attributeName, token.value);
      continue;
    }
  }
  for(;;)
  {
    Position pos = this->pos;
    if(readToken())
    {
      if(token.type == Token::endTagBeginType)
        break;
      if(token.type == Token::startTagBeginType)
      {
        Variant& variant = element.content.append(Variant());
        if(!parseElement(variant.toElement()))
          return false;
        continue;
      }
      else
        this->pos = pos;
    }
    String string;
    if(!parseText(string))
      return false;
    element.content.append(string);
  }
  if(!readToken())
    return false;
  if(token.type != Token::nameType)
    return syntaxError(token.pos, "Expected tag name"), false;
  if(token.value != element.type)
    return syntaxError(token.pos, String("Expected end tag of '") + element.type + ("'")), false;
  if(!readToken())
    return false;
  if(token.type != Token::tagEndType)
    return syntaxError(token.pos, "Expected '>'"), false;
  return true;
}